

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2int8.cpp
# Opt level: O2

int __thiscall NetQuantize::quantize_convolutiondepthwise(NetQuantize *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  undefined4 uVar4;
  int iVar5;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar6;
  Layer *pLVar7;
  void *__ptr;
  pointer pMVar8;
  pointer pMVar9;
  void *__ptr_00;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  Allocator *pAVar12;
  int *piVar13;
  long *plVar14;
  pointer pMVar15;
  bool bVar16;
  int iVar17;
  iterator iVar18;
  iterator iVar19;
  long lVar20;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
  *this_00;
  long lVar21;
  size_t sVar22;
  ulong uVar23;
  ulong uVar24;
  void *pvVar25;
  undefined1 local_318 [32];
  Allocator *local_2f8;
  int iStack_2f0;
  int iStack_2ec;
  int iStack_2e8;
  undefined8 uStack_2e4;
  size_t local_2d8;
  pointer *local_2c8;
  pointer local_2c0;
  undefined8 local_2b8;
  pointer local_2b0;
  ulong local_2a8;
  NetQuantize *local_2a0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
  *local_298;
  _Base_ptr local_290;
  Option *local_288;
  _Base_ptr local_280;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
  *local_278;
  Mat local_270;
  Mat local_228;
  Mat local_1e0;
  undefined4 local_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined8 local_188;
  undefined8 uStack_180;
  Option opt_q;
  char key [256];
  
  pvVar6 = (this->super_ModelWriter).layers;
  uVar23 = (ulong)((long)(pvVar6->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pvVar6->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                        _M_impl.super__Vector_impl_data._M_start) >> 3;
  local_278 = &this->blob_int8scale_table;
  local_280 = &(this->blob_int8scale_table)._M_t._M_impl.super__Rb_tree_header._M_header;
  this_00 = &this->weight_int8scale_table;
  local_290 = &(this->weight_int8scale_table)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_288 = &(this->super_ModelWriter).super_Net.opt;
  uVar24 = uVar23 & 0xffffffff;
  if ((int)uVar23 < 1) {
    uVar24 = 0;
  }
  uVar23 = 0;
  do {
    if (uVar23 == uVar24) {
      return 0;
    }
    bVar16 = std::operator!=(&(((this->super_ModelWriter).layers)->
                              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                              _M_impl.super__Vector_impl_data._M_start[uVar23]->type,
                             "ConvolutionDepthWise");
    if ((!bVar16) &&
       (iVar18 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
                 ::find(&local_278->_M_t,
                        &(((this->super_ModelWriter).layers)->
                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                         super__Vector_impl_data._M_start[uVar23]->name),
       iVar18._M_node != local_280)) {
      sprintf(key,"%s_param_0",
              ((((this->super_ModelWriter).layers)->
               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar23]->name)._M_dataplus._M_p);
      std::__cxx11::string::string((string *)local_318,key,(allocator *)&local_270);
      local_298 = this_00;
      iVar19 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
               ::find(&this_00->_M_t,(key_type *)local_318);
      std::__cxx11::string::~string((string *)local_318);
      if (iVar19._M_node == local_290) {
        fwrite("this layer need to be quantized, but no scale param!\n",0x35,1,_stderr);
        return -1;
      }
      pLVar7 = (((this->super_ModelWriter).layers)->
               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar23];
      __ptr = *(void **)(iVar18._M_node + 2);
      pMVar8 = (pointer)iVar18._M_node[2]._M_parent;
      local_2b0 = (pointer)iVar18._M_node[2]._M_left;
      uVar1 = *(undefined4 *)&iVar18._M_node[2]._M_right;
      pMVar9 = *(pointer *)(iVar18._M_node + 3);
      local_188 = iVar18._M_node[3]._M_parent;
      uStack_180 = iVar18._M_node[3]._M_left;
      uVar2 = *(undefined4 *)&iVar18._M_node[3]._M_right;
      local_2b8 = *(undefined8 *)(iVar18._M_node + 4);
      if (pMVar8 != (pointer)0x0) {
        LOCK();
        *(_Rb_tree_color *)&pMVar8->data = *(_Rb_tree_color *)&pMVar8->data + _S_black;
        UNLOCK();
      }
      __ptr_00 = *(void **)(iVar19._M_node + 2);
      p_Var10 = iVar19._M_node[2]._M_parent;
      p_Var11 = iVar19._M_node[2]._M_left;
      iVar3 = *(int *)&iVar19._M_node[2]._M_right;
      pAVar12 = *(Allocator **)(iVar19._M_node + 3);
      local_198 = *(undefined4 *)&iVar19._M_node[3]._M_parent;
      uStack_194 = *(undefined4 *)((long)&iVar19._M_node[3]._M_parent + 4);
      uStack_190 = *(undefined4 *)&iVar19._M_node[3]._M_left;
      uStack_18c = *(undefined4 *)((long)&iVar19._M_node[3]._M_left + 4);
      uVar4 = *(undefined4 *)&iVar19._M_node[3]._M_right;
      local_2c0 = *(pointer *)(iVar19._M_node + 4);
      if (p_Var10 != (_Base_ptr)0x0) {
        LOCK();
        p_Var10->_M_color = p_Var10->_M_color + _S_black;
        UNLOCK();
      }
      local_2a8 = uVar24;
      local_2a0 = this;
      fprintf(_stderr,"quantize_convolutiondepthwise %s\n",(pLVar7->name)._M_dataplus._M_p);
      local_2d8 = 0;
      local_318._0_8_ = (pointer)0x0;
      local_318._8_4_ = 0;
      local_318._12_4_ = 0;
      local_318._16_4_ = 0;
      local_318._20_4_ = 0;
      local_318._24_4_ = 0;
      iStack_2e8 = 0;
      uStack_2e4._0_4_ = 0;
      uStack_2e4._4_4_ = 0;
      local_2f8 = (Allocator *)0x0;
      iStack_2f0 = 0;
      iStack_2ec = 0;
      ncnn::Mat::create((Mat *)local_318,*(int *)((long)&pLVar7[1].type._M_dataplus._M_p + 4),1,
                        (Allocator *)0x0);
      bVar16 = true;
      if (((pointer)local_318._0_8_ != (pointer)0x0) && ((long)uStack_2e4._4_4_ * local_2d8 != 0)) {
        iVar5 = (int)pLVar7[1].type._M_string_length;
        iVar17 = *(int *)((long)&pLVar7[1].type._M_dataplus._M_p + 4) / iVar5;
        local_2c8 = &pLVar7[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
        sVar22 = (size_t)iVar17;
        lVar20 = 0;
        pvVar25 = __ptr_00;
        for (lVar21 = 0; lVar21 < iVar5; lVar21 = lVar21 + 1) {
          opt_q.lightmode = local_288->lightmode;
          opt_q._1_3_ = *(undefined3 *)&local_288->field_0x1;
          opt_q.num_threads = local_288->num_threads;
          opt_q.workspace_allocator = local_288->workspace_allocator;
          opt_q.openmp_blocktime = local_288->openmp_blocktime;
          opt_q.use_winograd_convolution = local_288->use_winograd_convolution;
          opt_q.use_sgemm_convolution = local_288->use_sgemm_convolution;
          opt_q.use_int8_inference = local_288->use_int8_inference;
          opt_q.use_vulkan_compute = local_288->use_vulkan_compute;
          uVar24._0_1_ = local_288->use_bf16_storage;
          uVar24._1_1_ = local_288->use_fp16_packed;
          uVar24._2_1_ = local_288->use_fp16_storage;
          uVar24._3_1_ = local_288->use_fp16_arithmetic;
          uVar24._4_1_ = local_288->use_int8_packed;
          uVar24._5_1_ = local_288->use_int8_storage;
          uVar24._6_1_ = local_288->use_int8_arithmetic;
          uVar24._7_1_ = local_288->use_packing_layout;
          opt_q.use_shader_pack8 = local_288->use_shader_pack8;
          opt_q.use_subgroup_basic = local_288->use_subgroup_basic;
          opt_q.use_subgroup_vote = local_288->use_subgroup_vote;
          opt_q.use_subgroup_ballot = local_288->use_subgroup_ballot;
          opt_q.use_subgroup_shuffle = local_288->use_subgroup_shuffle;
          opt_q.use_image_storage = local_288->use_image_storage;
          opt_q.use_tensor_storage = local_288->use_tensor_storage;
          opt_q.use_reserved_0 = local_288->use_reserved_0;
          opt_q.flush_denormals = local_288->flush_denormals;
          opt_q.use_local_pool_allocator = local_288->use_local_pool_allocator;
          opt_q.use_shader_local_memory = local_288->use_shader_local_memory;
          opt_q.use_cooperative_matrix = local_288->use_cooperative_matrix;
          opt_q.use_winograd23_convolution = local_288->use_winograd23_convolution;
          opt_q.use_winograd43_convolution = local_288->use_winograd43_convolution;
          opt_q.use_winograd63_convolution = local_288->use_winograd63_convolution;
          opt_q.use_a53_a55_optimized_kernel = local_288->use_a53_a55_optimized_kernel;
          opt_q.use_reserved_7 = local_288->use_reserved_7;
          opt_q.use_reserved_8 = local_288->use_reserved_8;
          opt_q.use_reserved_9 = local_288->use_reserved_9;
          opt_q.use_reserved_10 = local_288->use_reserved_10;
          opt_q.use_reserved_11 = local_288->use_reserved_11;
          opt_q.blob_allocator = local_2f8;
          opt_q._32_8_ = uVar24 & 0xffffffffffffff;
          local_270.elemsize =
               (size_t)pLVar7[1].bottom_shapes.
                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_finish;
          local_270.data =
               (void *)(local_270.elemsize * lVar20 +
                       (long)pLVar7[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage);
          local_270.elempack =
               *(int *)&pLVar7[1].bottom_shapes.
                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage;
          local_270.allocator =
               *(Allocator **)
                &pLVar7[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                 _M_impl.super__Vector_impl_data;
          local_270.refcount = (int *)0x0;
          local_228.elemsize = CONCAT44(local_318._20_4_,local_318._16_4_);
          local_228.data = (void *)(local_318._0_8_ + local_228.elemsize * lVar20);
          local_228.refcount = (int *)0x0;
          local_228.elempack = local_318._24_4_;
          local_228.allocator = local_2f8;
          local_270.dims = 1;
          local_270.h = 1;
          local_270.d = 1;
          local_228.h = 1;
          local_228.d = 1;
          local_1e0.refcount = (int *)0x0;
          local_1e0.dims = 1;
          local_1e0.w = 1;
          local_1e0.h = 1;
          local_1e0.d = 1;
          local_1e0.cstep = 1;
          local_270.w = iVar17;
          local_270.c = local_270.dims;
          local_270.cstep = sVar22;
          local_228.dims = local_270.dims;
          local_228.w = iVar17;
          local_228.c = local_270.dims;
          local_228.cstep = sVar22;
          local_1e0.data = pvVar25;
          local_1e0.elemsize = (size_t)p_Var11;
          local_1e0.elempack = iVar3;
          local_1e0.allocator = pAVar12;
          local_1e0.c = local_270.dims;
          ncnn::quantize_to_int8(&local_270,&local_228,&local_1e0,&opt_q);
          if (local_1e0.refcount != (int *)0x0) {
            LOCK();
            *local_1e0.refcount = *local_1e0.refcount + -1;
            UNLOCK();
            if (*local_1e0.refcount == 0) {
              if (local_1e0.allocator == (Allocator *)0x0) {
                free(local_1e0.data);
              }
              else {
                (*(local_1e0.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          if (local_228.refcount != (int *)0x0) {
            LOCK();
            *local_228.refcount = *local_228.refcount + -1;
            UNLOCK();
            if (*local_228.refcount == 0) {
              if (local_228.allocator == (Allocator *)0x0) {
                free(local_228.data);
              }
              else {
                (*(local_228.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          if (local_270.refcount != (int *)0x0) {
            LOCK();
            *local_270.refcount = *local_270.refcount + -1;
            UNLOCK();
            if (*local_270.refcount == 0) {
              if (local_270.allocator == (Allocator *)0x0) {
                free(local_270.data);
              }
              else {
                (*(local_270.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          iVar5 = (int)pLVar7[1].type._M_string_length;
          pvVar25 = (void *)((long)pvVar25 + (long)p_Var11);
          lVar20 = lVar20 + sVar22;
        }
        if (local_2c8 == (pointer *)local_318) {
          bVar16 = false;
        }
        else {
          piVar13 = (int *)CONCAT44(local_318._12_4_,local_318._8_4_);
          if (piVar13 != (int *)0x0) {
            LOCK();
            *piVar13 = *piVar13 + 1;
            UNLOCK();
          }
          piVar13 = *(int **)&pLVar7[1].bottom_shapes.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data;
          if (piVar13 != (int *)0x0) {
            LOCK();
            *piVar13 = *piVar13 + -1;
            UNLOCK();
            if (*piVar13 == 0) {
              plVar14 = *(long **)&pLVar7[1].top_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data;
              if (plVar14 == (long *)0x0) {
                free(pLVar7[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
              }
              else {
                (**(code **)(*plVar14 + 0x18))();
              }
            }
          }
          pLVar7[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)local_318._0_8_;
          *(ulong *)&pLVar7[1].bottom_shapes.
                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                     super__Vector_impl_data = CONCAT44(local_318._12_4_,local_318._8_4_);
          pLVar7[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)CONCAT44(local_318._20_4_,local_318._16_4_);
          *(undefined4 *)
           &pLVar7[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = local_318._24_4_;
          *(Allocator **)
           &pLVar7[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data = local_2f8;
          *(int *)&pLVar7[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                   _M_impl.super__Vector_impl_data._M_finish = iStack_2f0;
          *(int *)((long)&pLVar7[1].top_shapes.
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                          super__Vector_impl_data._M_finish + 4) = iStack_2ec;
          *(int *)&pLVar7[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage = iStack_2e8;
          *(int *)((long)&pLVar7[1].top_shapes.
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 4) = (int)uStack_2e4;
          *(int *)&pLVar7[2]._vptr_Layer = uStack_2e4._4_4_;
          pLVar7[2].one_blob_only = (bool)(undefined1)local_2d8;
          pLVar7[2].support_inplace = (bool)local_2d8._1_1_;
          pLVar7[2].support_vulkan = (bool)local_2d8._2_1_;
          pLVar7[2].support_packing = (bool)local_2d8._3_1_;
          pLVar7[2].support_bf16_storage = (bool)local_2d8._4_1_;
          pLVar7[2].support_fp16_storage = (bool)local_2d8._5_1_;
          pLVar7[2].support_int8_storage = (bool)local_2d8._6_1_;
          pLVar7[2].support_image_storage = (bool)local_2d8._7_1_;
          bVar16 = false;
        }
      }
      piVar13 = (int *)CONCAT44(local_318._12_4_,local_318._8_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (local_2f8 == (Allocator *)0x0) {
            free((void *)local_318._0_8_);
          }
          else {
            (*local_2f8->_vptr_Allocator[3])();
          }
        }
      }
      if (!bVar16) {
        *(undefined4 *)((long)&pLVar7[1].type._M_string_length + 4) = 1;
        if (p_Var10 != (_Base_ptr)0x0) {
          LOCK();
          p_Var10->_M_color = p_Var10->_M_color + _S_black;
          UNLOCK();
        }
        piVar13 = *(int **)&pLVar7[2].name.field_2;
        if (piVar13 != (int *)0x0) {
          LOCK();
          *piVar13 = *piVar13 + -1;
          UNLOCK();
          if (*piVar13 == 0) {
            plVar14 = (long *)pLVar7[2].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_finish;
            if (plVar14 == (long *)0x0) {
              free((void *)pLVar7[2].name._M_string_length);
            }
            else {
              (**(code **)(*plVar14 + 0x18))();
            }
          }
        }
        pLVar7[2].name._M_string_length = (size_type)__ptr_00;
        pLVar7[2].name.field_2._M_allocated_capacity = (size_type)p_Var10;
        *(_Base_ptr *)((long)&pLVar7[2].name.field_2 + 8) = p_Var11;
        *(int *)&pLVar7[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data = iVar3;
        pLVar7[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)pAVar12;
        *(undefined4 *)
         &pLVar7[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = local_198;
        *(undefined4 *)
         ((long)&pLVar7[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 4) = uStack_194;
        *(undefined4 *)
         &pLVar7[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data = uStack_190;
        *(undefined4 *)
         ((long)&pLVar7[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + 4) = uStack_18c;
        *(undefined4 *)
         &pLVar7[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = uVar4;
        pLVar7[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = local_2c0;
        if (pMVar8 != (pointer)0x0) {
          LOCK();
          *(_Rb_tree_color *)&pMVar8->data = *(_Rb_tree_color *)&pMVar8->data + _S_black;
          UNLOCK();
        }
        pMVar15 = pLVar7[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if (pMVar15 != (pointer)0x0) {
          LOCK();
          *(int *)&pMVar15->data = *(int *)&pMVar15->data + -1;
          UNLOCK();
          if (*(int *)&pMVar15->data == 0) {
            pMVar15 = pLVar7[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if (pMVar15 == (pointer)0x0) {
              free(pLVar7[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                   ._M_impl.super__Vector_impl_data._M_start);
            }
            else {
              (**(code **)((long)pMVar15->data + 0x18))();
            }
          }
        }
        pLVar7[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start = __ptr;
        pLVar7[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_finish = pMVar8;
        pLVar7[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = local_2b0;
        *(undefined4 *)
         &pLVar7[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data = uVar1;
        pLVar7[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_finish = pMVar9;
        *(undefined4 *)
         &pLVar7[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (undefined4)local_188;
        *(undefined4 *)
         ((long)&pLVar7[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = local_188._4_4_;
        *(undefined4 *)&pLVar7[3]._vptr_Layer = (undefined4)uStack_180;
        *(undefined4 *)((long)&pLVar7[3]._vptr_Layer + 4) = uStack_180._4_4_;
        pLVar7[3].one_blob_only = (bool)(char)uVar2;
        pLVar7[3].support_inplace = (bool)(char)((uint)uVar2 >> 8);
        pLVar7[3].support_vulkan = (bool)(char)((uint)uVar2 >> 0x10);
        pLVar7[3].support_packing = (bool)(char)((uint)uVar2 >> 0x18);
        pLVar7[3].support_tensor_storage = (bool)(undefined1)local_2b8;
        pLVar7[3].support_reserved_00 = (bool)local_2b8._1_1_;
        pLVar7[3].support_reserved_0 = (bool)local_2b8._2_1_;
        pLVar7[3].support_reserved_1 = (bool)local_2b8._3_1_;
        pLVar7[3].support_reserved_2 = (bool)local_2b8._4_1_;
        pLVar7[3].support_reserved_3 = (bool)local_2b8._5_1_;
        pLVar7[3].support_reserved_4 = (bool)local_2b8._6_1_;
        pLVar7[3].support_reserved_5 = (bool)local_2b8._7_1_;
      }
      if (p_Var10 != (_Base_ptr)0x0) {
        LOCK();
        p_Var10->_M_color = p_Var10->_M_color - _S_black;
        UNLOCK();
        if (p_Var10->_M_color == _S_red) {
          if (pAVar12 == (Allocator *)0x0) {
            free(__ptr_00);
          }
          else {
            (*pAVar12->_vptr_Allocator[3])(pAVar12,__ptr_00);
          }
        }
      }
      if (pMVar8 != (pointer)0x0) {
        LOCK();
        *(_Rb_tree_color *)&pMVar8->data = *(_Rb_tree_color *)&pMVar8->data - _S_black;
        UNLOCK();
        if (*(_Rb_tree_color *)&pMVar8->data == _S_red) {
          if (pMVar9 == (pointer)0x0) {
            free(__ptr);
          }
          else {
            (**(code **)((long)pMVar9->data + 0x18))(pMVar9,__ptr);
          }
        }
      }
      this = local_2a0;
      this_00 = local_298;
      uVar24 = local_2a8;
      if (bVar16) {
        return -100;
      }
    }
    uVar23 = uVar23 + 1;
  } while( true );
}

Assistant:

int NetQuantize::quantize_convolutiondepthwise()
{
    const int layer_count = static_cast<int>(layers.size());
    for (int i = 0; i < layer_count; i++)
    {
        // find convolution layer
        if (layers[i]->type != "ConvolutionDepthWise")
            continue;

        // find convolutiondepthwise layer
        std::map<std::string, ncnn::Mat>::iterator iter_data = blob_int8scale_table.find(layers[i]->name);
        if (iter_data == blob_int8scale_table.end())
            continue;

        char key[256];
        sprintf(key, "%s_param_0", layers[i]->name.c_str());

        std::map<std::string, ncnn::Mat>::iterator iter = weight_int8scale_table.find(key);
        if (iter == weight_int8scale_table.end())
        {
            fprintf(stderr, "this layer need to be quantized, but no scale param!\n");
            return -1;
        }

        // Convolution - quantize weight from fp32 to int8
        ncnn::ConvolutionDepthWise* convdw = (ncnn::ConvolutionDepthWise*)layers[i];

        ncnn::Mat bottom_blob_int8_scales = iter_data->second;
        ncnn::Mat weight_data_int8_scales = iter->second;

        fprintf(stderr, "quantize_convolutiondepthwise %s\n", convdw->name.c_str());

        {
            ncnn::Mat int8_weight_data(convdw->weight_data_size, (size_t)1u);
            if (int8_weight_data.empty())
                return -100;

            const int weight_data_size_g = convdw->weight_data_size / convdw->group;

            for (int g = 0; g < convdw->group; g++)
            {
                ncnn::Option opt_q = opt;
                opt_q.blob_allocator = int8_weight_data.allocator;
                opt_q.use_packing_layout = false;

                const ncnn::Mat weight_data_g = convdw->weight_data.range(weight_data_size_g * g, weight_data_size_g);
                ncnn::Mat int8_weight_data_g = int8_weight_data.range(weight_data_size_g * g, weight_data_size_g);
                const ncnn::Mat weight_data_int8_scales_g = weight_data_int8_scales.range(g, 1);
                ncnn::quantize_to_int8(weight_data_g, int8_weight_data_g, weight_data_int8_scales_g, opt_q);
            }

            convdw->weight_data = int8_weight_data;
        }

        convdw->int8_scale_term = 1;
        convdw->weight_data_int8_scales = weight_data_int8_scales;
        convdw->bottom_blob_int8_scales = bottom_blob_int8_scales;
    }

    return 0;
}